

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEventList.cpp
# Opt level: O3

int __thiscall smf::MidiEventList::markSequence(MidiEventList *this,int sequence)

{
  pointer ppMVar1;
  uint uVar2;
  ulong uVar3;
  
  ppMVar1 = (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar2 = (uint)((ulong)((long)(this->list).
                               super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar1) >> 3);
  if (0 < (int)uVar2) {
    uVar3 = 0;
    do {
      ppMVar1[uVar3]->seq = sequence + (int)uVar3;
      uVar3 = uVar3 + 1;
    } while ((uVar2 & 0x7fffffff) != uVar3);
    sequence = sequence + (int)uVar3;
  }
  return sequence;
}

Assistant:

int MidiEventList::markSequence(int sequence) {
	for (int i=0; i<getEventCount(); i++) {
		getEvent(i).seq = sequence++;
	}
	return sequence;
}